

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
operator/(long lhs,
         SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs)

{
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> SVar1;
  bool bVar2;
  short sVar3;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> in_SI;
  long *in_RDI;
  long ret;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> result;
  undefined6 in_stack_ffffffffffffffd8;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  *in_stack_ffffffffffffffe0;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *this;
  undefined2 in_stack_ffffffffffffffe8;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> SVar4;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_ffffffffffffffee;
  short local_2;
  
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::SafeInt
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)&stack0xffffffffffffffee);
  SVar4.m_int = in_SI.m_int;
  bVar2 = DivisionCornerCaseHelper<short,_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>,_0>
          ::DivisionCornerCase1
                    ((long)in_RDI,in_SI,
                     (SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                      *)&stack0xffffffffffffffee);
  SVar1.m_int = in_stack_ffffffffffffffee.m_int;
  if ((!bVar2) &&
     (bVar2 = DivisionCornerCaseHelper2<short,_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>,_1>
              ::DivisionCornerCase2
                        (CONCAT26(in_stack_ffffffffffffffee.m_int,
                                  CONCAT24(SVar4.m_int,
                                           CONCAT22(in_SI.m_int,in_stack_ffffffffffffffe8))),
                         (SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                          )(short)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffffe0),
     SVar1.m_int = in_stack_ffffffffffffffee.m_int, !bVar2)) {
    this = (SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
           )0x0;
    sVar3 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)0x0);
    DivisionHelper<long,short,5>::
    DivideThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
              (in_RDI,(short *)CONCAT26(in_stack_ffffffffffffffee.m_int,
                                        CONCAT24(SVar4.m_int,
                                                 CONCAT22(in_SI.m_int,in_stack_ffffffffffffffe8))),
               (long *)this);
    SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
    SafeInt<long>(this,(long *)CONCAT26(sVar3,in_stack_ffffffffffffffd8));
    SVar1.m_int = local_2;
  }
  local_2 = SVar1.m_int;
  return (SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>)
         local_2;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator /( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Corner case - has to be handled seperately
    SafeInt< T, E > result;
    if( DivisionCornerCaseHelper< T, U, E, (int)DivisionMethod< U, T >::method == (int)DivisionState_UnsignedSigned >::DivisionCornerCase1( lhs, rhs, result ) )
        return result;

    if( DivisionCornerCaseHelper2< T, U, E, safeint_internal::type_compare< T, U >::isBothSigned >::DivisionCornerCase2( lhs, rhs, result ) )
        return result;

    // Otherwise normal logic works with addition of bounds check when casting from U->T
    U ret = 0;
    DivisionHelper< U, T, DivisionMethod< U, T >::method >::template DivideThrow< E >( lhs, (T)rhs, ret );
    return SafeInt< T, E >( ret );
}